

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  undefined4 in_register_00000034;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_00;
  
  this_00 = (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)
            CONCAT44(in_register_00000034,__fd);
  std::istream::seekg(&this_00->stream_,(long)__buf * 0x38 + (this_00->data_begin_)._M_off,
                      (this_00->data_begin_)._M_state);
  check_stream(this_00,"seekg for read");
  (this->filename_)._M_pathname._M_dataplus._M_p = (pointer)0x0;
  (this->filename_)._M_pathname._M_string_length = 0x7ff0000000000000;
  (this->filename_)._M_pathname.field_2._M_allocated_capacity = 0xfff0000000000000;
  *(undefined8 *)((long)&(this->filename_)._M_pathname.field_2 + 8) = 0;
  *(undefined8 *)&(this->filename_)._M_cmpts = 0;
  *(undefined8 *)&this->stream_ = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::istream::read((char *)&this_00->stream_,(long)this);
  check_stream(this_00,"read");
  return (ssize_t)this;
}

Assistant:

value_type read(pos_type pos)
    {
        stream_.seekg(data_begin_ + static_cast<pos_type>(pos * value_size));
        check_stream("seekg for read");
        return read<value_type>();
    }